

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

double __thiscall soplex::SPxLPBase<double>::maxAbsNzo(SPxLPBase<double> *this,bool unscaled)

{
  int iVar1;
  Item *pIVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  undefined7 in_register_00000031;
  long lVar6;
  long lVar7;
  long lVar8;
  Nonzero<double> *pNVar9;
  double extraout_XMM0_Qa;
  double dVar10;
  double dVar11;
  double dVar12;
  
  if (((int)CONCAT71(in_register_00000031,unscaled) == 0) || (this->_isScaled != true)) {
    lVar3 = (long)(this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
    if (0 < lVar3) {
      pIVar2 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem;
      lVar6 = 0;
      dVar11 = 0.0;
      do {
        iVar1 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[lVar6].idx;
        lVar8 = (long)pIVar2[iVar1].data.super_SVectorBase<double>.memused;
        dVar10 = 0.0;
        if (0 < lVar8) {
          lVar7 = lVar8 + 1;
          pNVar9 = pIVar2[iVar1].data.super_SVectorBase<double>.m_elem + lVar8;
          dVar12 = 0.0;
          do {
            pNVar9 = pNVar9 + -1;
            dVar10 = ABS(pNVar9->val);
            if (ABS(pNVar9->val) <= dVar12) {
              dVar10 = dVar12;
            }
            lVar7 = lVar7 + -1;
            dVar12 = dVar10;
          } while (1 < lVar7);
        }
        if (dVar10 <= dVar11) {
          dVar10 = dVar11;
        }
        lVar6 = lVar6 + 1;
        dVar11 = dVar10;
      } while (lVar6 != lVar3);
      return dVar10;
    }
  }
  else if (0 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
    uVar5 = 0;
    dVar11 = 0.0;
    do {
      (*this->lp_scaler->_vptr_SPxScaler[0x12])(this->lp_scaler,this,uVar5);
      dVar10 = extraout_XMM0_Qa;
      if (extraout_XMM0_Qa <= dVar11) {
        dVar10 = dVar11;
      }
      uVar4 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar4;
      dVar11 = dVar10;
    } while ((int)uVar4 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
    return dVar10;
  }
  return 0.0;
}

Assistant:

inline
R SPxLPBase<R>::maxAbsNzo(bool unscaled) const
{
   R maxi = 0.0;

   if(unscaled && _isScaled)
   {
      assert(lp_scaler != nullptr);

      for(int i = 0; i < nCols(); ++i)
      {
         R m = lp_scaler->getColMaxAbsUnscaled(*this, i);

         if(m > maxi)
            maxi = m;
      }
   }
   else
   {
      for(int i = 0; i < nCols(); ++i)
      {
         R m = colVector(i).maxAbs();

         if(m > maxi)
            maxi = m;
      }
   }

   assert(maxi >= 0.0);

   return maxi;
}